

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::~vector
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this)

{
  memory_resource *pmVar1;
  
  this->nStored = 0;
  if (this->ptr != (ShapeHandle *)0x0) {
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 3,8);
  }
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }